

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_dirhie.c
# Opt level: O1

CURLcode create_dir_hierarchy(char *outfile,FILE *errors)

{
  bool bVar1;
  int iVar2;
  size_t sVar3;
  char *__s;
  char *__s_00;
  char *pcVar4;
  char *pcVar5;
  size_t sVar6;
  int *piVar7;
  size_t sVar8;
  char *pcVar9;
  CURLcode CVar10;
  
  sVar3 = strlen(outfile);
  __s = strdup(outfile);
  if (__s == (char *)0x0) {
    CVar10 = CURLE_OUT_OF_MEMORY;
  }
  else {
    __s_00 = (char *)malloc(sVar3 + 1);
    if (__s_00 == (char *)0x0) {
      CVar10 = CURLE_OUT_OF_MEMORY;
    }
    else {
      *__s_00 = '\0';
      pcVar4 = strtok(__s,"/");
      if (pcVar4 == (char *)0x0) {
        CVar10 = CURLE_OK;
      }
      else {
        CVar10 = CURLE_OK;
        do {
          pcVar5 = strtok((char *)0x0,"/");
          if (pcVar5 != (char *)0x0) {
            sVar6 = strlen(__s_00);
            if (sVar6 == 0) {
              sVar8 = sVar3;
              pcVar9 = __s_00;
              if (__s != pcVar4) goto LAB_0010d184;
              strcpy(__s_00,pcVar4);
            }
            else {
              sVar8 = sVar3 - sVar6;
              pcVar9 = __s_00 + sVar6;
LAB_0010d184:
              curl_msnprintf(pcVar9,sVar8,"%s%s","/",pcVar4);
            }
            iVar2 = mkdir(__s_00,0x1e8);
            bVar1 = true;
            if (iVar2 == -1) {
              piVar7 = __errno_location();
              iVar2 = *piVar7;
              if (iVar2 < 0x1e) {
                pcVar4 = "You don\'t have permission to create %s.\n";
                if (iVar2 != 0xd) {
                  if (iVar2 == 0x11) goto LAB_0010d231;
                  if (iVar2 == 0x1c) {
                    pcVar4 = 
                    "No space left on the file system that will contain the directory %s.\n";
                  }
                  else {
LAB_0010d20a:
                    pcVar4 = "Error creating directory %s.\n";
                  }
                }
              }
              else if (iVar2 == 0x1e) {
                pcVar4 = "%s resides on a read-only file system.\n";
              }
              else if (iVar2 == 0x7a) {
                pcVar4 = "Cannot create directory %s because you exceeded your quota.\n";
              }
              else {
                if (iVar2 != 0x24) goto LAB_0010d20a;
                pcVar4 = "The directory name %s is too long.\n";
              }
              bVar1 = false;
              curl_mfprintf(errors,pcVar4,__s_00);
              CVar10 = CURLE_WRITE_ERROR;
            }
LAB_0010d231:
            if (!bVar1) break;
          }
          pcVar4 = pcVar5;
        } while (pcVar5 != (char *)0x0);
      }
      free(__s_00);
    }
    free(__s);
  }
  return CVar10;
}

Assistant:

CURLcode create_dir_hierarchy(const char *outfile, FILE *errors)
{
  char *tempdir;
  char *tempdir2;
  char *outdup;
  char *dirbuildup;
  CURLcode result = CURLE_OK;
  size_t outlen;

  outlen = strlen(outfile);
  outdup = strdup(outfile);
  if(!outdup)
    return CURLE_OUT_OF_MEMORY;

  dirbuildup = malloc(outlen + 1);
  if(!dirbuildup) {
    Curl_safefree(outdup);
    return CURLE_OUT_OF_MEMORY;
  }
  dirbuildup[0] = '\0';

  /* Allow strtok() here since this isn't used threaded */
  /* !checksrc! disable BANNEDFUNC 2 */
  tempdir = strtok(outdup, PATH_DELIMITERS);

  while(tempdir != NULL) {
    tempdir2 = strtok(NULL, PATH_DELIMITERS);
    /* since strtok returns a token for the last word even
       if not ending with DIR_CHAR, we need to prune it */
    if(tempdir2 != NULL) {
      size_t dlen = strlen(dirbuildup);
      if(dlen)
        msnprintf(&dirbuildup[dlen], outlen - dlen, "%s%s", DIR_CHAR, tempdir);
      else {
        if(outdup == tempdir)
          /* the output string doesn't start with a separator */
          strcpy(dirbuildup, tempdir);
        else
          msnprintf(dirbuildup, outlen, "%s%s", DIR_CHAR, tempdir);
      }
      if((-1 == mkdir(dirbuildup, (mode_t)0000750)) && (errno != EEXIST)) {
        show_dir_errno(errors, dirbuildup);
        result = CURLE_WRITE_ERROR;
        break; /* get out of loop */
      }
    }
    tempdir = tempdir2;
  }

  Curl_safefree(dirbuildup);
  Curl_safefree(outdup);

  return result;
}